

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

xmlChar * xmlC11NNormalizeString(xmlChar *input,xmlC14NNormalizationMode mode)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar xVar4;
  xmlChar *pxVar5;
  uint uVar6;
  xmlChar *pxVar7;
  bool bVar8;
  
  if ((input == (xmlChar *)0x0) ||
     (pxVar2 = (xmlChar *)(*xmlMalloc)(1000), pxVar2 == (xmlChar *)0x0)) {
LAB_00162208:
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    xVar4 = *input;
    pxVar3 = pxVar2;
    if (xVar4 != '\0') {
      pxVar7 = input + 1;
      uVar6 = 1000;
      pxVar5 = pxVar2;
      do {
        pxVar3 = pxVar5;
        if ((long)(int)(uVar6 - 10) < (long)pxVar2 - (long)pxVar5) {
          if ((int)uVar6 < 1) {
            uVar6 = 1;
LAB_00162123:
            pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar5,(size_t)uVar6);
            if (pxVar3 != (xmlChar *)0x0) {
              pxVar2 = pxVar3 + (int)((long)pxVar2 - (long)pxVar5);
              xVar4 = pxVar7[-1];
              goto LAB_00162142;
            }
          }
          else if (uVar6 < 1000000000) {
            uVar1 = uVar6 + 1 >> 1;
            bVar8 = 1000000000 - uVar1 < uVar6;
            uVar6 = uVar1 + uVar6;
            if (bVar8) {
              uVar6 = 1000000000;
            }
            goto LAB_00162123;
          }
          (*xmlFree)(pxVar5);
          goto LAB_00162208;
        }
LAB_00162142:
        if (xVar4 == '<') {
          if ((mode == XMLC14N_NORMALIZE_TEXT) || (mode == XMLC14N_NORMALIZE_ATTR)) {
            builtin_memcpy(pxVar2,"&lt;",4);
LAB_0016216c:
            pxVar2 = pxVar2 + 4;
          }
          else {
LAB_001621df:
            *pxVar2 = xVar4;
            pxVar2 = pxVar2 + 1;
          }
        }
        else {
          if ((mode == XMLC14N_NORMALIZE_TEXT) && (xVar4 == '>')) {
            builtin_memcpy(pxVar2,"&gt;",4);
            goto LAB_0016216c;
          }
          if (xVar4 == '&') {
            if ((mode != XMLC14N_NORMALIZE_TEXT) && (mode != XMLC14N_NORMALIZE_ATTR))
            goto LAB_001621df;
            builtin_memcpy(pxVar2,"&amp",4);
          }
          else {
            if ((mode == XMLC14N_NORMALIZE_ATTR) && (xVar4 == '\"')) {
              builtin_memcpy(pxVar2,"&quot;",6);
              pxVar2 = pxVar2 + 6;
              goto LAB_001621e4;
            }
            if ((mode == XMLC14N_NORMALIZE_ATTR) && (xVar4 == '\t')) {
              builtin_memcpy(pxVar2,"&#x9",4);
            }
            else if ((mode == XMLC14N_NORMALIZE_ATTR) && (xVar4 == '\n')) {
              builtin_memcpy(pxVar2,"&#xA",4);
            }
            else {
              if ((XMLC14N_NORMALIZE_TEXT < mode) || (xVar4 != '\r')) goto LAB_001621df;
              builtin_memcpy(pxVar2,"&#xD",4);
            }
          }
          pxVar2[4] = ';';
          pxVar2 = pxVar2 + 5;
        }
LAB_001621e4:
        xVar4 = *pxVar7;
        pxVar7 = pxVar7 + 1;
        pxVar5 = pxVar3;
      } while (xVar4 != '\0');
    }
    *pxVar2 = '\0';
  }
  return pxVar3;
}

Assistant:

static xmlChar *
xmlC11NNormalizeString(const xmlChar * input,
                       xmlC14NNormalizationMode mode)
{
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    int buffer_size = 0;

    if (input == NULL)
        return (NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = xmlMalloc(buffer_size);
    if (buffer == NULL)
        return (NULL);
    out = buffer;

    while (*cur != '\0') {
        if ((out - buffer) > (buffer_size - 10)) {
            xmlChar *tmp;
            int indx = out - buffer;
            int newSize;

            newSize = xmlGrowCapacity(buffer_size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
                xmlFree(buffer);
                return(NULL);
            }
            tmp = xmlRealloc(buffer, newSize);
            if (tmp == NULL) {
                xmlFree(buffer);
                return(NULL);
            }
            buffer = tmp;
            buffer_size = newSize;
            out = &buffer[indx];
        }

        if ((*cur == '<') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                              (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'l';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '>') && (mode == XMLC14N_NORMALIZE_TEXT)) {
            *out++ = '&';
            *out++ = 'g';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '&') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                     (mode == XMLC14N_NORMALIZE_TEXT))) {
            *out++ = '&';
            *out++ = 'a';
            *out++ = 'm';
            *out++ = 'p';
            *out++ = ';';
        } else if ((*cur == '"') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = 'q';
            *out++ = 'u';
            *out++ = 'o';
            *out++ = 't';
            *out++ = ';';
        } else if ((*cur == '\x09') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = '9';
            *out++ = ';';
        } else if ((*cur == '\x0A') && (mode == XMLC14N_NORMALIZE_ATTR)) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'A';
            *out++ = ';';
        } else if ((*cur == '\x0D') && ((mode == XMLC14N_NORMALIZE_ATTR) ||
                                        (mode == XMLC14N_NORMALIZE_TEXT) ||
                                        (mode == XMLC14N_NORMALIZE_COMMENT) ||
					(mode == XMLC14N_NORMALIZE_PI))) {
            *out++ = '&';
            *out++ = '#';
            *out++ = 'x';
            *out++ = 'D';
            *out++ = ';';
        } else {
            /*
             * Works because on UTF-8, all extended sequences cannot
             * result in bytes in the ASCII range.
             */
            *out++ = *cur;
        }
        cur++;
    }
    *out = 0;
    return (buffer);
}